

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O0

void __thiscall
asio::detail::executor_function::
executor_function<asio::detail::binder1<helics::MessageTimer::addTimer(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,helics::ActionMessage)::__0,std::error_code>,std::allocator<void>>
          (executor_function *this,
          binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>
          *f,allocator<void> *a)

{
  impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>,_std::allocator<void>_>
  *f_00;
  allocator<void> *in_RSI;
  undefined8 *in_RDI;
  ptr p;
  impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>,_std::allocator<void>_>
  *in_stack_ffffffffffffffc0;
  
  f_00 = impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>,_std::allocator<void>_>
         ::ptr::allocate(in_RSI);
  impl<asio::detail::binder1<helics::MessageTimer::addTimer(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,helics::ActionMessage)::$_0,std::error_code>,std::allocator<void>>
  ::
  impl<asio::detail::binder1<helics::MessageTimer::addTimer(std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,helics::ActionMessage)::__0,std::error_code>>
            (in_stack_ffffffffffffffc0,
             (binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:50:26),_std::error_code>
              *)f_00,in_RSI);
  *in_RDI = f_00;
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:50:26),_std::error_code>,_std::allocator<void>_>
  ::ptr::~ptr((ptr *)0x5ca9dd);
  return;
}

Assistant:

explicit executor_function(F f, const Alloc& a)
  {
    // Allocate and construct an object to wrap the function.
    typedef impl<F, Alloc> impl_type;
    typename impl_type::ptr p = {
      detail::addressof(a), impl_type::ptr::allocate(a), 0 };
    impl_ = new (p.v) impl_type(static_cast<F&&>(f), a);
    p.v = 0;
  }